

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void RigidBodyDynamics::ComputeConstraintImpulsesDirect
               (Model *model,VectorNd *Q,VectorNd *QDotMinus,ConstraintSet *CS,VectorNd *QDotPlus)

{
  Scalar *pSVar1;
  ulong uVar2;
  size_t sVar3;
  long in_RCX;
  long in_RDI;
  long index;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *this;
  uint i_1;
  uint i;
  MatrixNd *in_stack_000002c8;
  VectorNd *in_stack_000002d0;
  VectorNd *in_stack_000002d8;
  VectorNd *in_stack_000002e0;
  MatrixNd *in_stack_000002e8;
  MatrixNd *in_stack_000002f0;
  VectorNd *in_stack_00000300;
  VectorNd *in_stack_00000308;
  LinearSolver *in_stack_00000310;
  VectorNd *in_stack_000003b8;
  VectorNd *in_stack_000003c0;
  VectorNd *in_stack_000003c8;
  Model *in_stack_000003d0;
  undefined1 in_stack_00000daf;
  MatrixNd *in_stack_00000db0;
  VectorNd *in_stack_00000db8;
  Model *in_stack_00000dc0;
  EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  *in_stack_ffffffffffffff48;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff50;
  MatrixNd *in_stack_ffffffffffffff58;
  ConstraintSet *in_stack_ffffffffffffff60;
  Scalar SVar4;
  VectorNd *in_stack_ffffffffffffff68;
  Model *in_stack_ffffffffffffff70;
  undefined4 local_64;
  undefined4 local_60;
  
  UpdateKinematicsCustom(in_stack_000003d0,in_stack_000003c8,in_stack_000003c0,in_stack_000003b8);
  CompositeRigidBodyAlgorithm
            (in_stack_00000dc0,in_stack_00000db8,in_stack_00000db0,(bool)in_stack_00000daf);
  CalcConstraintsJacobian
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0));
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (in_stack_ffffffffffffff50,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff48);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
  ;
  index = in_RCX + 0x1c8;
  this = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)(in_RCX + 0x1d8);
  SolveConstrainedSystemDirect
            (in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,
             in_stack_000002d0,in_stack_000002c8,in_stack_00000300,in_stack_00000308,
             in_stack_00000310);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6df749);
  for (local_60 = 0; local_60 < *(uint *)(in_RDI + 0x48); local_60 = local_60 + 1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,index);
    SVar4 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,index);
    *pSVar1 = SVar4;
  }
  local_64 = 0;
  while( true ) {
    uVar2 = (ulong)local_64;
    sVar3 = ConstraintSet::size((ConstraintSet *)0x6df7eb);
    if (sVar3 <= uVar2) break;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,index);
    SVar4 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,index);
    *pSVar1 = SVar4;
    local_64 = local_64 + 1;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ComputeConstraintImpulsesDirect (
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDotMinus,
  ConstraintSet &CS,
  Math::VectorNd &QDotPlus
)
{

  // Compute H
  UpdateKinematicsCustom (model, &Q, NULL, NULL);
  CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

  // Compute G
  CalcConstraintsJacobian (model, Q, CS, CS.G, false);

  SolveConstrainedSystemDirect (CS.H, CS.G, CS.H * QDotMinus, CS.v_plus
                                , CS.impulse, CS.A, CS.b, CS.x, CS.linear_solver);

  // Copy back QDotPlus
  for (unsigned int i = 0; i < model.dof_count; i++) {
    QDotPlus[i] = CS.x[i];
  }

  // Copy back constraint impulses
  for (unsigned int i = 0; i < CS.size(); i++) {
    CS.impulse[i] = CS.x[model.dof_count + i];
  }

}